

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O2

void P_DrawSplash(int count,DVector3 *pos,DAngle *angle,int kind)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  particle_t *ppVar7;
  bool bVar8;
  double dVar9;
  
  iVar3 = yorange;
  iVar2 = orange;
  if (kind == 1) {
    while ((bVar8 = count != 0, count = count + -1, bVar8 &&
           (ppVar7 = JitterParticle(10), ppVar7 != (particle_t *)0x0))) {
      ppVar7->size = 2.0;
      iVar4 = FRandom::operator()(&M_Random);
      iVar5 = iVar2;
      if (-1 < (char)iVar4) {
        iVar5 = iVar3;
      }
      ppVar7->color = iVar5;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar7->Vel).Z = (double)iVar5 * -0.0078125 + (ppVar7->Vel).Z;
      (ppVar7->Acc).Z = (ppVar7->Acc).Z + -0.125;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar7->Acc).X = (double)(iVar5 + -0x80) * 0.0001220703125 + (ppVar7->Acc).X;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar7->Acc).Y = (double)(iVar5 + -0x80) * 0.0001220703125 + (ppVar7->Acc).Y;
      dVar1 = pos->Z;
      iVar5 = FRandom::operator()(&M_Random);
      (ppVar7->Pos).Z = (double)iVar5 * -0.015625 + dVar1;
      iVar5 = FRandom::operator()(&M_Random);
      angle->Degrees = (double)iVar5 * 0.17578125 + angle->Degrees;
      dVar1 = pos->X;
      uVar6 = FRandom::operator()(&M_Random);
      dVar9 = TAngle<double>::Cos(angle);
      (ppVar7->Pos).X = dVar9 * (double)(uVar6 & 0xf) + dVar1;
      dVar1 = pos->Y;
      uVar6 = FRandom::operator()(&M_Random);
      dVar9 = TAngle<double>::Sin(angle);
      (ppVar7->Pos).Y = dVar9 * (double)(uVar6 & 0xf) + dVar1;
    }
  }
  return;
}

Assistant:

void P_DrawSplash (int count, const DVector3 &pos, DAngle angle, int kind)
{
	int color1, color2;

	switch (kind)
	{
	case 1:		// Spark
		color1 = orange;
		color2 = yorange;
		break;
	default:
		return;
	}

	for (; count; count--)
	{
		particle_t *p = JitterParticle (10);

		if (!p)
			break;

		p->size = 2;
		p->color = M_Random() & 0x80 ? color1 : color2;
		p->Vel.Z -= M_Random () / 128.;
		p->Acc.Z -= 1./8;
		p->Acc.X += (M_Random () - 128) / 8192.;
		p->Acc.Y += (M_Random () - 128) / 8192.;
		p->Pos.Z = pos.Z - M_Random () / 64.;
		angle += M_Random() * (45./256);
		p->Pos.X = pos.X + (M_Random() & 15)*angle.Cos();
		p->Pos.Y = pos.Y + (M_Random() & 15)*angle.Sin();
	}
}